

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZCompElHDivCollapsed.cpp
# Opt level: O2

void __thiscall
TPZCompElHDivCollapsed<pzshape::TPZShapeQuad>::TPZCompElHDivCollapsed
          (TPZCompElHDivCollapsed<pzshape::TPZShapeQuad> *this,void **vtt,TPZCompMesh *mesh,
          TPZGeoEl *gel)

{
  void *pvVar1;
  TPZGeoEl *pTVar2;
  
  TPZCompElHDiv<pzshape::TPZShapeQuad>::TPZCompElHDiv
            (&this->super_TPZCompElHDiv<pzshape::TPZShapeQuad>,vtt + 1,mesh,gel,EHDivStandard);
  pvVar1 = *vtt;
  *(void **)&(this->super_TPZCompElHDiv<pzshape::TPZShapeQuad>).
             super_TPZIntelGen<pzshape::TPZShapeQuad>.super_TPZInterpolatedElement.
             super_TPZInterpolationSpace.super_TPZCompEl = pvVar1;
  *(void **)((long)(this->super_TPZCompElHDiv<pzshape::TPZShapeQuad>).fSideOrient.fExtAlloc +
            *(long *)((long)pvVar1 + -0x60) + -0x70) = vtt[0xb];
  *(undefined4 *)&this->fbottom_c_index = 0xffffffff;
  *(undefined4 *)((long)&this->fbottom_c_index + 4) = 0xffffffff;
  *(undefined4 *)&this->ftop_c_index = 0xffffffff;
  *(undefined4 *)((long)&this->ftop_c_index + 4) = 0xffffffff;
  this->fbottom_side_orient = -1;
  this->ftop_side_orient = 1;
  pTVar2 = TPZCompEl::Reference((TPZCompEl *)this);
  pTVar2->fReference = (TPZCompEl *)this;
  return;
}

Assistant:

TPZCompElHDivCollapsed<TSHAPE>::TPZCompElHDivCollapsed(TPZCompMesh &mesh, TPZGeoEl *gel) :
TPZRegisterClassId(&TPZCompElHDivCollapsed::ClassId),
TPZCompElHDiv<TSHAPE>(mesh,gel)
{
//    fbottom_c_index = -1; set at constructor in .h
//    ftop_c_index = -1; set at constructor in .h
//    fbottom_side_orient = -1; in .h
//    ftop_side_orient = 1; in .h
    this->Reference()->SetReference(this);
    

#ifdef PZ_LOG
    if (logger.isDebugEnabled())
	 {
         std::stringstream sout;
         sout << "Finalizando criacao do elemento ";
         this->Print(sout);
         LOGPZ_DEBUG(logger,sout.str())
	 }
#endif
	 
}